

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O1

bool __thiscall
ArmParser::parseThumbParameters
          (ArmParser *this,Parser *parser,tThumbOpcode *opcode,ThumbOpcodeVariables *vars)

{
  byte bVar1;
  byte symbol;
  int iVar2;
  bool bVar3;
  Token *pTVar4;
  ulong uVar5;
  ArmParser *this_00;
  byte *pbVar6;
  byte *pbVar7;
  bool bVar8;
  bool bVar9;
  ArmRegisterValue tempRegister;
  ArmRegisterValue local_58;
  
  local_58.name._name._M_dataplus._M_p = (pointer)&local_58.name._name.field_2;
  local_58.name._name.field_2._8_8_ = 0;
  local_58.name._name._M_string_length = 0;
  local_58.name._name.field_2._M_allocated_capacity = 0;
  this_00 = this;
  pbVar6 = (byte *)opcode->mask;
  do {
    bVar1 = *pbVar6;
    if (bVar1 == 0) {
      pTVar4 = Tokenizer::nextToken
                         ((parser->entries).
                          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
      bVar3 = pTVar4->type == Separator;
      goto LAB_00162236;
    }
    uVar5 = (ulong)(bVar1 == 0x2f);
    pbVar7 = pbVar6 + uVar5 + 1;
    symbol = pbVar6[uVar5];
    if (symbol < 0x53) {
      if (symbol == 0x44) {
        bVar3 = parseRegisterTable(this_00,parser,&vars->rd,armRegisters,0x13);
        iVar2 = (vars->rd).num;
        bVar9 = SBORROW4(iVar2,0x10);
        bVar8 = iVar2 + -0x10 < 0;
        goto LAB_00162203;
      }
      if (symbol == 0x49) goto switchD_001620c3_caseD_69;
      if (symbol == 0x52) {
        bVar3 = parseRegisterList(this_00,parser,&vars->rlist,
                                  (int)(char)pbVar6[uVar5 + 2] << 8 | (int)(char)pbVar6[uVar5 + 1]);
        if (bVar3) {
          pbVar7 = pbVar6 + uVar5 + 3;
          goto LAB_0016220d;
        }
        goto LAB_00162214;
      }
switchD_001620c3_caseD_6a:
      bVar3 = matchSymbol(this_00,parser,symbol,bVar1 == 0x2f);
      if (!bVar3) goto LAB_00162214;
LAB_0016220d:
      bVar3 = true;
    }
    else {
      switch(symbol) {
      case 0x69:
switchD_001620c3_caseD_69:
        this_00 = this;
        bVar3 = parseImmediate(this,parser,&vars->ImmediateExpression);
        if (!bVar3) goto LAB_00162214;
        pbVar7 = pbVar6 + uVar5 + 2;
        vars->ImmediateBitLen = (int)(char)pbVar6[uVar5 + 1];
        goto LAB_0016220d;
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x6d:
      case 0x70:
      case 0x71:
        goto switchD_001620c3_caseD_6a;
      case 0x6e:
        bVar3 = parseRegisterTable(this_00,parser,&vars->rn,armRegisters,0x13);
        iVar2 = (vars->rn).num;
        bVar9 = SBORROW4(iVar2,8);
        bVar8 = iVar2 + -8 < 0;
        break;
      case 0x6f:
        bVar3 = parseRegisterTable(this_00,parser,&vars->ro,armRegisters,0x13);
        iVar2 = (vars->ro).num;
        bVar9 = SBORROW4(iVar2,8);
        bVar8 = iVar2 + -8 < 0;
        break;
      case 0x72:
        bVar3 = parseRegisterTable(this_00,parser,&local_58,armRegisters,0x13);
        if (!bVar3 || 0xf < local_58.num) goto LAB_00162214;
        pbVar7 = pbVar6 + uVar5 + 2;
        if (local_58.num == (char)pbVar6[uVar5 + 1]) goto LAB_0016220d;
        bVar3 = false;
        goto LAB_00162216;
      case 0x73:
        bVar3 = parseRegisterTable(this_00,parser,&vars->rs,armRegisters,0x13);
        iVar2 = (vars->rs).num;
        bVar9 = SBORROW4(iVar2,8);
        bVar8 = iVar2 + -8 < 0;
        break;
      default:
        if (symbol == 0x53) {
          bVar3 = parseRegisterTable(this_00,parser,&vars->rs,armRegisters,0x13);
          iVar2 = (vars->rs).num;
          bVar9 = SBORROW4(iVar2,0x10);
          bVar8 = iVar2 + -0x10 < 0;
        }
        else {
          if (symbol != 100) goto switchD_001620c3_caseD_6a;
          bVar3 = parseRegisterTable(this_00,parser,&vars->rd,armRegisters,0x13);
          iVar2 = (vars->rd).num;
          bVar9 = SBORROW4(iVar2,8);
          bVar8 = iVar2 + -8 < 0;
        }
      }
LAB_00162203:
      if ((bVar3 & bVar9 != bVar8) != 0) goto LAB_0016220d;
LAB_00162214:
      bVar3 = false;
    }
LAB_00162216:
    pbVar6 = pbVar7;
  } while (bVar3);
  bVar3 = false;
LAB_00162236:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._name._M_dataplus._M_p != &local_58.name._name.field_2) {
    operator_delete(local_58.name._name._M_dataplus._M_p,
                    local_58.name._name.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool ArmParser::parseThumbParameters(Parser& parser, const tThumbOpcode& opcode, ThumbOpcodeVariables& vars)
{
	const char* encoding = opcode.mask;

	ArmRegisterValue tempRegister;
	int value;

	while (*encoding != 0)
	{
		bool optional = *encoding == '/';
		if (optional)
			encoding++;

		switch (*encoding++)
		{
		case 'd': // register
			CHECK(parseRegister(parser,vars.rd,7));
			break;
		case 's': // register
			CHECK(parseRegister(parser,vars.rs,7));
			break;
		case 'n': // register
			CHECK(parseRegister(parser,vars.rn,7));
			break;
		case 'o': // register
			CHECK(parseRegister(parser,vars.ro,7));
			break;
		case 'D': // register
			CHECK(parseRegister(parser,vars.rd,15));
			break;
		case 'S': // register
			CHECK(parseRegister(parser,vars.rs,15));
			break;
		case 'r': // forced register
			CHECK(parseRegister(parser,tempRegister,15));
			CHECK(*encoding++ == tempRegister.num);
			break;
		case 'R':	// register list
			value = encoding[0] | (encoding[1] << 8);
			CHECK(parseRegisterList(parser,vars.rlist,value));
			encoding += 2;
			break;
		case 'I':	// immediate
		case 'i':
			CHECK(parseImmediate(parser,vars.ImmediateExpression));
			vars.ImmediateBitLen = *encoding++;
			break;
		default:
			CHECK(matchSymbol(parser,*(encoding-1),optional));
			break;
		}
	}
	
	// the next token has to be a separator, else the parameters aren't
	// completely parsed
	return parser.nextToken().type == TokenType::Separator;
}